

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_UnexpectedExceptionFailure_StandardException_TestShell::
~TEST_TestFailure_UnexpectedExceptionFailure_StandardException_TestShell
          (TEST_TestFailure_UnexpectedExceptionFailure_StandardException_TestShell *this)

{
  TEST_TestFailure_UnexpectedExceptionFailure_StandardException_TestShell *this_local;
  
  ~TEST_TestFailure_UnexpectedExceptionFailure_StandardException_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestFailure, UnexpectedExceptionFailure_StandardException)
{
    std::runtime_error e("Some error");
    UnexpectedExceptionFailure f(test, e);
#if CPPUTEST_HAVE_RTTI
    STRCMP_CONTAINS("Unexpected exception of type '", f.getMessage().asCharString());
    STRCMP_CONTAINS("runtime_error", f.getMessage().asCharString());
    STRCMP_CONTAINS("' was thrown: Some error", f.getMessage().asCharString());
#else
    FAILURE_EQUAL("Unexpected exception of unknown type was thrown.", f);
#endif
}